

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O0

void __thiscall Secp256K1::Secp256K1(Secp256K1 *this,string *privateKey)

{
  bool bVar1;
  secp256k1_context *psVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  Secp256K1Exception *pSVar3;
  undefined1 local_38 [8];
  string priv;
  string *privateKey_local;
  Secp256K1 *this_local;
  
  priv.field_2._8_8_ = privateKey;
  psVar2 = secp256k1_context_create(0x301);
  this->ctx = psVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->pubKey);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->privKey);
  base16Decode((string *)local_38,(string *)priv.field_2._8_8_);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->privKey,__first,__last);
  bVar1 = verifyKey(this);
  if (!bVar1) {
    pSVar3 = (Secp256K1Exception *)__cxa_allocate_exception(0x10);
    Secp256K1Exception::Secp256K1Exception(pSVar3,"Unable to create and verify key:  ");
    __cxa_throw(pSVar3,&Secp256K1Exception::typeinfo,Secp256K1Exception::~Secp256K1Exception);
  }
  bVar1 = createPublicKey(this,false);
  if (!bVar1) {
    pSVar3 = (Secp256K1Exception *)__cxa_allocate_exception(0x10);
    Secp256K1Exception::Secp256K1Exception(pSVar3,"Unable to create publick key");
    __cxa_throw(pSVar3,&Secp256K1Exception::typeinfo,Secp256K1Exception::~Secp256K1Exception);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

Secp256K1::Secp256K1(const std::string& privateKey)
    : ctx(secp256k1_context_create(SECP256K1_CONTEXT_SIGN | SECP256K1_CONTEXT_VERIFY))
{
    auto priv = Secp256K1::base16Decode(privateKey);

    privKey.assign(privateKey.begin(), privateKey.end());
    //verify priv key
    if (!verifyKey()) {
        throw Secp256K1Exception("Unable to create and verify key:  ");
    }

//    std::cout << privKey.data();

    if (!createPublicKey()) {
        throw Secp256K1Exception("Unable to create publick key");
    }
}